

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_check_poc_val
                   (opj_poc_t *p_pocs,OPJ_UINT32 p_nb_pocs,OPJ_UINT32 p_nb_resolutions,
                   OPJ_UINT32 p_num_comps,OPJ_UINT32 p_num_layers,opj_event_mgr_t *p_manager)

{
  bool bVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  OPJ_BOOL extraout_EAX;
  OPJ_BOOL OVar4;
  void *ptr;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  OPJ_UINT32 OVar9;
  uint uVar10;
  uint uVar11;
  OPJ_UINT32 OVar12;
  uint uVar13;
  int iVar14;
  
  iVar14 = p_num_comps * p_nb_resolutions;
  ptr = opj_calloc((ulong)(iVar14 * p_num_layers),4);
  if (ptr != (void *)0x0) {
    uVar2 = p_pocs->resno0;
    uVar10 = p_pocs->resno1;
    if (uVar2 < uVar10) {
      iVar5 = uVar2 * p_num_comps;
      uVar13 = p_pocs->compno1;
      do {
        uVar8 = p_pocs->compno0;
        if (uVar8 < uVar13) {
          uVar11 = uVar8 + iVar5;
          uVar10 = p_pocs->layno1;
          do {
            if (uVar10 == 0) {
              uVar10 = 0;
            }
            else {
              uVar7 = 0;
              uVar13 = uVar11;
              do {
                *(undefined4 *)((long)ptr + (ulong)uVar13 * 4) = 1;
                uVar13 = uVar13 + iVar14;
                uVar7 = uVar7 + 1;
                uVar10 = p_pocs->layno1;
              } while (uVar7 < uVar10);
              uVar13 = p_pocs->compno1;
            }
            uVar11 = uVar11 + 1;
            uVar8 = uVar8 + 1;
          } while (uVar8 < uVar13);
          uVar10 = p_pocs->resno1;
        }
        iVar5 = iVar5 + p_num_comps;
        uVar2 = uVar2 + 1;
      } while (uVar2 < uVar10);
    }
    if (1 < p_nb_pocs) {
      OVar3 = 1;
      do {
        uVar2 = p_pocs[1].layno1;
        uVar10 = p_pocs->layno1;
        if (uVar2 <= p_pocs->layno1) {
          uVar10 = 0;
        }
        uVar13 = p_pocs[1].resno0;
        uVar8 = p_pocs[1].resno1;
        if (uVar13 < uVar8) {
          iVar5 = uVar13 * p_num_comps;
          OVar9 = p_pocs[1].compno1;
          do {
            uVar11 = p_pocs[1].compno0;
            if (uVar11 < OVar9) {
              iVar6 = uVar11 + iVar5;
              do {
                if (uVar10 < uVar2) {
                  uVar7 = iVar6 + uVar10 * iVar14;
                  uVar8 = uVar10;
                  do {
                    *(undefined4 *)((long)ptr + (ulong)uVar7 * 4) = 1;
                    uVar7 = uVar7 + iVar14;
                    uVar8 = uVar8 + 1;
                    uVar2 = p_pocs[1].layno1;
                  } while (uVar8 < uVar2);
                  OVar9 = p_pocs[1].compno1;
                }
                iVar6 = iVar6 + 1;
                uVar11 = uVar11 + 1;
              } while (uVar11 < OVar9);
              uVar8 = p_pocs[1].resno1;
            }
            iVar5 = iVar5 + p_num_comps;
            uVar13 = uVar13 + 1;
          } while (uVar13 < uVar8);
        }
        p_pocs = p_pocs + 1;
        OVar3 = OVar3 + 1;
      } while (OVar3 != p_nb_pocs);
    }
    if (p_num_layers != 0) {
      bVar1 = false;
      iVar5 = 0;
      OVar3 = 0;
      do {
        if (p_nb_resolutions != 0) {
          OVar9 = 0;
          iVar6 = iVar5;
          do {
            if (p_num_comps != 0) {
              OVar12 = 0;
              do {
                bVar1 = (bool)(bVar1 | *(int *)((long)ptr + (ulong)(iVar6 + OVar12) * 4) != 1);
                OVar12 = OVar12 + 1;
              } while (p_num_comps != OVar12);
            }
            OVar9 = OVar9 + 1;
            iVar6 = iVar6 + p_num_comps;
          } while (OVar9 != p_nb_resolutions);
          iVar5 = iVar5 + iVar14;
        }
        OVar3 = OVar3 + 1;
      } while (OVar3 != p_num_layers);
      if (bVar1) {
        opj_event_msg(p_manager,1,"Missing packets possible loss of data\n");
      }
    }
    opj_free(ptr);
    return extraout_EAX;
  }
  OVar4 = opj_event_msg(p_manager,1,"Not enough memory for checking the poc values.\n");
  return OVar4;
}

Assistant:

static OPJ_BOOL opj_j2k_check_poc_val(const opj_poc_t *p_pocs,
                                      OPJ_UINT32 p_nb_pocs,
                                      OPJ_UINT32 p_nb_resolutions,
                                      OPJ_UINT32 p_num_comps,
                                      OPJ_UINT32 p_num_layers,
                                      opj_event_mgr_t * p_manager)
{
    OPJ_UINT32* packet_array;
    OPJ_UINT32 index, resno, compno, layno;
    OPJ_UINT32 i;
    OPJ_UINT32 step_c = 1;
    OPJ_UINT32 step_r = p_num_comps * step_c;
    OPJ_UINT32 step_l = p_nb_resolutions * step_r;
    OPJ_BOOL loss = OPJ_FALSE;
    OPJ_UINT32 layno0 = 0;

    packet_array = (OPJ_UINT32*) opj_calloc(step_l * p_num_layers,
                                            sizeof(OPJ_UINT32));
    if (packet_array == 00) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough memory for checking the poc values.\n");
        return OPJ_FALSE;
    }

    if (p_nb_pocs == 0) {
        opj_free(packet_array);
        return OPJ_TRUE;
    }

    index = step_r * p_pocs->resno0;
    /* take each resolution for each poc */
    for (resno = p_pocs->resno0 ; resno < p_pocs->resno1 ; ++resno) {
        OPJ_UINT32 res_index = index + p_pocs->compno0 * step_c;

        /* take each comp of each resolution for each poc */
        for (compno = p_pocs->compno0 ; compno < p_pocs->compno1 ; ++compno) {
            OPJ_UINT32 comp_index = res_index + layno0 * step_l;

            /* and finally take each layer of each res of ... */
            for (layno = layno0; layno < p_pocs->layno1 ; ++layno) {
                /*index = step_r * resno + step_c * compno + step_l * layno;*/
                packet_array[comp_index] = 1;
                comp_index += step_l;
            }

            res_index += step_c;
        }

        index += step_r;
    }
    ++p_pocs;

    /* iterate through all the pocs */
    for (i = 1; i < p_nb_pocs ; ++i) {
        OPJ_UINT32 l_last_layno1 = (p_pocs - 1)->layno1 ;

        layno0 = (p_pocs->layno1 > l_last_layno1) ? l_last_layno1 : 0;
        index = step_r * p_pocs->resno0;

        /* take each resolution for each poc */
        for (resno = p_pocs->resno0 ; resno < p_pocs->resno1 ; ++resno) {
            OPJ_UINT32 res_index = index + p_pocs->compno0 * step_c;

            /* take each comp of each resolution for each poc */
            for (compno = p_pocs->compno0 ; compno < p_pocs->compno1 ; ++compno) {
                OPJ_UINT32 comp_index = res_index + layno0 * step_l;

                /* and finally take each layer of each res of ... */
                for (layno = layno0; layno < p_pocs->layno1 ; ++layno) {
                    /*index = step_r * resno + step_c * compno + step_l * layno;*/
                    packet_array[comp_index] = 1;
                    comp_index += step_l;
                }

                res_index += step_c;
            }

            index += step_r;
        }

        ++p_pocs;
    }

    index = 0;
    for (layno = 0; layno < p_num_layers ; ++layno) {
        for (resno = 0; resno < p_nb_resolutions; ++resno) {
            for (compno = 0; compno < p_num_comps; ++compno) {
                loss |= (packet_array[index] != 1);
                /*index = step_r * resno + step_c * compno + step_l * layno;*/
                index += step_c;
            }
        }
    }

    if (loss) {
        opj_event_msg(p_manager, EVT_ERROR, "Missing packets possible loss of data\n");
    }

    opj_free(packet_array);

    return !loss;
}